

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall
QMimeXMLProvider::addFileNameMatches
          (QMimeXMLProvider *this,QString *fileName,QMimeGlobMatchResult *result)

{
  long lVar1;
  function<bool_(const_QString_&)> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  AddMatchFilterFunc *unaff_retaddr;
  QMimeGlobMatchResult *in_stack_00000008;
  QString *in_stack_00000010;
  QMimeAllGlobPatterns *in_stack_00000018;
  anon_class_8_1_8991fb9c filterFunc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::function<bool(QString_const&)>::
  function<QMimeXMLProvider::addFileNameMatches(QString_const&,QMimeGlobMatchResult&)::__0&,void>
            (in_RSI,(anon_class_8_1_8991fb9c *)(in_RDI + 0x48));
  QMimeAllGlobPatterns::matchingGlobs
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::function<bool_(const_QString_&)>::~function((function<bool_(const_QString_&)> *)0x8fddaa);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeXMLProvider::addFileNameMatches(const QString &fileName, QMimeGlobMatchResult &result)
{
    auto filterFunc = [this](const QString &name) { return !isMimeTypeGlobsExcluded(name); };
    m_mimeTypeGlobs.matchingGlobs(fileName, result, filterFunc);
}